

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerKeepAlive.cpp
# Opt level: O1

void __thiscall
ki::protocol::control::ServerKeepAlive::read_from(ServerKeepAlive *this,istream *istream)

{
  Field<int> *pFVar1;
  Record record;
  ostringstream oss;
  string local_250;
  string local_230 [2];
  Record local_1f0 [5];
  
  ki::dml::Record::Record(local_1f0);
  local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"m_session_id","");
  ki::dml::Record::add_field<unsigned_short>(local_1f0,local_230,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
    operator_delete(local_230[0]._M_dataplus._M_p);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"m_timestamp","");
  pFVar1 = ki::dml::Record::add_field<int>(local_1f0,&local_250,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  ki::dml::Record::read_from(local_1f0,istream);
  this->m_timestamp = pFVar1->m_value;
  ki::dml::Record::~Record(local_1f0);
  return;
}

Assistant:

void ServerKeepAlive::read_from(std::istream& istream)
	{
		dml::Record record;
		record.add_field<dml::USHRT>("m_session_id");
		auto *timestamp = record.add_field<dml::INT>("m_timestamp");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ServerKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_timestamp = timestamp->get_value();
	}